

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O1

void report(void)

{
  ulong uVar1;
  
  if ((verbosity == 0) ||
     ((long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= num_unreached_bads)) {
    if (bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      msg(1,"no bad state property reached");
    }
  }
  else {
    printf("[btorsim] reached bad state properties {");
    if (bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar1 = 0;
      do {
        if (-1 < reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar1]) {
          printf(" b%lu@%ld",uVar1);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)bads.
                                     super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)bads.
                                     super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    puts(" }");
  }
  if (-1 < constraints_violated) {
    msg(1,"constraints violated at time %ld");
    return;
  }
  if (constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    msg(1,"constraints always satisfied");
    return;
  }
  return;
}

Assistant:

static void
report ()
{
  if (verbosity && num_unreached_bads < (int64_t) bads.size ())
  {
    printf ("[btorsim] reached bad state properties {");
    for (size_t i = 0; i < bads.size (); i++)
    {
      int64_t r = reached_bads[i];
      if (r >= 0) printf (" b%lu@%" PRId64, i, r);
    }
    printf (" }\n");
  }
  else if (!bads.empty ())
    msg (1, "no bad state property reached");

  if (constraints_violated >= 0)
    msg (1, "constraints violated at time %" PRId64, constraints_violated);
  else if (!constraints.empty ())
    msg (1, "constraints always satisfied");
}